

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connect.c
# Opt level: O0

CURLcode Curl_is_connected(connectdata *conn,int sockindex,_Bool *connected)

{
  Curl_easy *data_00;
  long lVar1;
  timeval newer;
  int iVar2;
  _Bool _Var3;
  uint uVar4;
  CURLcode CVar5;
  time_t tVar6;
  time_t tVar7;
  int *piVar8;
  char *pcVar9;
  timeval tVar10;
  time_t local_d8;
  char *local_b0;
  char *hostname;
  char ipaddress [46];
  CURLcode status;
  int other;
  __suseconds_t local_68;
  uint local_60;
  int i;
  int rc;
  timeval now;
  int error;
  time_t allow;
  CURLcode result;
  Curl_easy *data;
  _Bool *connected_local;
  int sockindex_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  allow._4_4_ = CURLE_OK;
  now.tv_usec._4_4_ = 0;
  *connected = false;
  if (((conn->bits).tcpconnect[sockindex] & 1U) == 0) {
    tVar10 = curlx_tvnow();
    _status = tVar10.tv_sec;
    _i = _status;
    local_68 = tVar10.tv_usec;
    now.tv_sec = local_68;
    tVar6 = Curl_timeleft(data_00,(timeval *)&i,true);
    if (tVar6 < 0) {
      Curl_failf(data_00,"Connection time-out");
      conn_local._4_4_ = CURLE_OPERATION_TIMEDOUT;
    }
    else {
      for (local_60 = 0; (int)local_60 < 2; local_60 = local_60 + 1) {
        register0x00000000 = local_60 ^ 1;
        if (conn->tempsock[(int)local_60] != -1) {
          uVar4 = Curl_socket_check(-1,-1,conn->tempsock[(int)local_60],0);
          if (uVar4 == 0) {
            now.tv_usec._4_4_ = 0;
            tVar10.tv_usec = now.tv_sec;
            tVar10.tv_sec = _i;
            tVar7 = curlx_tvdiff(tVar10,conn->connecttime);
            if (conn->timeoutms_per_addr <= tVar7) {
              Curl_infof(data_00,"After %ldms connect time, move on!\n",conn->timeoutms_per_addr);
              now.tv_usec._4_4_ = 0x6e;
            }
            if (((local_60 == 0) && (conn->tempaddr[1] == (Curl_addrinfo *)0x0)) &&
               (newer.tv_usec = now.tv_sec, newer.tv_sec = _i,
               tVar7 = curlx_tvdiff(newer,conn->connecttime), 199 < tVar7)) {
              trynextip(conn,sockindex,1);
            }
          }
          else if ((uVar4 == 2) || (((conn->bits).tcp_fastopen & 1U) != 0)) {
            _Var3 = verifyconnect(conn->tempsock[(int)local_60],(int *)((long)&now.tv_usec + 4));
            if (_Var3) {
              conn->sock[sockindex] = conn->tempsock[(int)local_60];
              conn->ip_addr = conn->tempaddr[(int)local_60];
              conn->tempsock[(int)local_60] = -1;
              if (conn->tempsock[(int)stack0xffffffffffffff8c] != -1) {
                Curl_closesocket(conn,conn->tempsock[(int)stack0xffffffffffffff8c]);
                conn->tempsock[(int)stack0xffffffffffffff8c] = -1;
              }
              CVar5 = Curl_connected_proxy(conn,sockindex);
              if (CVar5 != CURLE_OK) {
                return CVar5;
              }
              (conn->bits).tcpconnect[sockindex] = true;
              *connected = true;
              if (sockindex == 0) {
                Curl_pgrsTime(data_00,TIMER_CONNECT);
              }
              Curl_updateconninfo(conn,conn->sock[sockindex]);
              Curl_verboseconnect(conn);
              return CURLE_OK;
            }
            Curl_infof(data_00,"Connection failed\n");
          }
          else if ((uVar4 & 4) != 0) {
            verifyconnect(conn->tempsock[(int)local_60],(int *)((long)&now.tv_usec + 4));
          }
          iVar2 = now.tv_usec._4_4_;
          if (now.tv_usec._4_4_ != 0) {
            (data_00->state).os_errno = now.tv_usec._4_4_;
            piVar8 = __errno_location();
            *piVar8 = iVar2;
            if (conn->tempaddr[(int)local_60] != (Curl_addrinfo *)0x0) {
              Curl_printable_address(conn->tempaddr[(int)local_60],(char *)&hostname,0x2e);
              lVar1 = conn->port;
              pcVar9 = Curl_strerror(conn,now.tv_usec._4_4_);
              Curl_infof(data_00,"connect to %s port %ld failed: %s\n",&hostname,lVar1,pcVar9);
              local_d8 = tVar6;
              if (conn->tempaddr[(int)local_60]->ai_next != (Curl_addrinfo *)0x0) {
                local_d8 = tVar6 / 2;
              }
              conn->timeoutms_per_addr = local_d8;
              ipaddress._40_4_ = trynextip(conn,sockindex,local_60);
              if ((ipaddress._40_4_ != CURLE_COULDNT_CONNECT) ||
                 (conn->tempsock[(int)stack0xffffffffffffff8c] == -1)) {
                allow._4_4_ = ipaddress._40_4_;
              }
            }
          }
        }
      }
      if (allow._4_4_ != CURLE_OK) {
        if ((conn->tempaddr[1] == (Curl_addrinfo *)0x0) &&
           (allow._4_4_ = trynextip(conn,sockindex,1), allow._4_4_ == CURLE_OK)) {
          return CURLE_OK;
        }
        if (((conn->bits).socksproxy & 1U) == 0) {
          if (((conn->bits).httpproxy & 1U) == 0) {
            if (((conn->bits).conn_to_host & 1U) == 0) {
              local_b0 = (conn->host).name;
            }
            else {
              local_b0 = (conn->conn_to_host).name;
            }
          }
          else {
            local_b0 = (conn->http_proxy).host.name;
          }
        }
        else {
          local_b0 = (conn->socks_proxy).host.name;
        }
        lVar1 = conn->port;
        pcVar9 = Curl_strerror(conn,now.tv_usec._4_4_);
        Curl_failf(data_00,"Failed to connect to %s port %ld: %s",local_b0,lVar1,pcVar9);
      }
      conn_local._4_4_ = allow._4_4_;
    }
  }
  else {
    *connected = true;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

CURLcode Curl_is_connected(struct connectdata *conn,
                           int sockindex,
                           bool *connected)
{
  struct Curl_easy *data = conn->data;
  CURLcode result = CURLE_OK;
  time_t allow;
  int error = 0;
  struct timeval now;
  int rc;
  int i;

  DEBUGASSERT(sockindex >= FIRSTSOCKET && sockindex <= SECONDARYSOCKET);

  *connected = FALSE; /* a very negative world view is best */

  if(conn->bits.tcpconnect[sockindex]) {
    /* we are connected already! */
    *connected = TRUE;
    return CURLE_OK;
  }

  now = Curl_tvnow();

  /* figure out how long time we have left to connect */
  allow = Curl_timeleft(data, &now, TRUE);

  if(allow < 0) {
    /* time-out, bail out, go home */
    failf(data, "Connection time-out");
    return CURLE_OPERATION_TIMEDOUT;
  }

  for(i=0; i<2; i++) {
    const int other = i ^ 1;
    if(conn->tempsock[i] == CURL_SOCKET_BAD)
      continue;

#ifdef mpeix
    /* Call this function once now, and ignore the results. We do this to
       "clear" the error state on the socket so that we can later read it
       reliably. This is reported necessary on the MPE/iX operating system. */
    (void)verifyconnect(conn->tempsock[i], NULL);
#endif

    /* check socket for connect */
    rc = SOCKET_WRITABLE(conn->tempsock[i], 0);

    if(rc == 0) { /* no connection yet */
      error = 0;
      if(curlx_tvdiff(now, conn->connecttime) >= conn->timeoutms_per_addr) {
        infof(data, "After %ldms connect time, move on!\n",
              conn->timeoutms_per_addr);
        error = ETIMEDOUT;
      }

      /* should we try another protocol family? */
      if(i == 0 && conn->tempaddr[1] == NULL &&
         curlx_tvdiff(now, conn->connecttime) >= HAPPY_EYEBALLS_TIMEOUT) {
        trynextip(conn, sockindex, 1);
      }
    }
    else if(rc == CURL_CSELECT_OUT || conn->bits.tcp_fastopen) {
      if(verifyconnect(conn->tempsock[i], &error)) {
        /* we are connected with TCP, awesome! */

        /* use this socket from now on */
        conn->sock[sockindex] = conn->tempsock[i];
        conn->ip_addr = conn->tempaddr[i];
        conn->tempsock[i] = CURL_SOCKET_BAD;

        /* close the other socket, if open */
        if(conn->tempsock[other] != CURL_SOCKET_BAD) {
          Curl_closesocket(conn, conn->tempsock[other]);
          conn->tempsock[other] = CURL_SOCKET_BAD;
        }

        /* see if we need to do any proxy magic first once we connected */
        result = Curl_connected_proxy(conn, sockindex);
        if(result)
          return result;

        conn->bits.tcpconnect[sockindex] = TRUE;

        *connected = TRUE;
        if(sockindex == FIRSTSOCKET)
          Curl_pgrsTime(data, TIMER_CONNECT); /* connect done */
        Curl_updateconninfo(conn, conn->sock[sockindex]);
        Curl_verboseconnect(conn);

        return CURLE_OK;
      }
      infof(data, "Connection failed\n");
    }
    else if(rc & CURL_CSELECT_ERR)
      (void)verifyconnect(conn->tempsock[i], &error);

    /*
     * The connection failed here, we should attempt to connect to the "next
     * address" for the given host. But first remember the latest error.
     */
    if(error) {
      data->state.os_errno = error;
      SET_SOCKERRNO(error);
      if(conn->tempaddr[i]) {
        CURLcode status;
        char ipaddress[MAX_IPADR_LEN];
        Curl_printable_address(conn->tempaddr[i], ipaddress, MAX_IPADR_LEN);
        infof(data, "connect to %s port %ld failed: %s\n",
              ipaddress, conn->port, Curl_strerror(conn, error));

        conn->timeoutms_per_addr = conn->tempaddr[i]->ai_next == NULL ?
                                   allow : allow / 2;

        status = trynextip(conn, sockindex, i);
        if(status != CURLE_COULDNT_CONNECT
            || conn->tempsock[other] == CURL_SOCKET_BAD)
          /* the last attempt failed and no other sockets remain open */
          result = status;
      }
    }
  }

  if(result) {
    /* no more addresses to try */

    const char *hostname;

    /* if the first address family runs out of addresses to try before
       the happy eyeball timeout, go ahead and try the next family now */
    if(conn->tempaddr[1] == NULL) {
      result = trynextip(conn, sockindex, 1);
      if(!result)
        return result;
    }

    if(conn->bits.socksproxy)
      hostname = conn->socks_proxy.host.name;
    else if(conn->bits.httpproxy)
      hostname = conn->http_proxy.host.name;
    else if(conn->bits.conn_to_host)
      hostname = conn->conn_to_host.name;
    else
      hostname = conn->host.name;

    failf(data, "Failed to connect to %s port %ld: %s",
        hostname, conn->port, Curl_strerror(conn, error));
  }

  return result;
}